

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O2

void __thiscall flatfile_tests::flatfile_filename::test_method(flatfile_filename *this)

{
  long lVar1;
  path dir;
  path dir_00;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  FlatFileSeq *pFVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined8 in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd81;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffd88;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  FlatFilePos pos;
  path local_210;
  path local_1e8;
  undefined1 local_1c0 [40];
  path local_198;
  path local_170;
  FlatFileSeq seq2;
  path local_110;
  path local_e8;
  path local_c0;
  FlatFileSeq seq1;
  path data_dir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((path *)&data_dir.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  pos.nFile = 0x1c8;
  pos.nPos = 0x315;
  std::filesystem::__cxx11::path::path(&local_c0,&data_dir.super_path);
  dir.super_path._M_pathname._M_string_length = in_stack_fffffffffffffd70;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd68;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffd78;
  dir.super_path._M_pathname.field_2._M_local_buf[8] = in_stack_fffffffffffffd80;
  dir.super_path._M_pathname.field_2._9_7_ = in_stack_fffffffffffffd81;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffd88._M_head_impl;
  FlatFileSeq::FlatFileSeq(&seq1,dir,(char *)&local_c0,0xbaa2de);
  std::filesystem::__cxx11::path::~path(&local_c0);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x16;
  file.m_begin = (iterator)&local_228;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_238,msg);
  local_1c0[8] = 0;
  local_1c0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_1c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1c0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_240 = "";
  FlatFileSeq::FileName(&seq2.m_dir,&seq1,&pos);
  std::filesystem::__cxx11::path::path(&local_110,&data_dir.super_path);
  fs::operator/((path *)&local_e8,(path *)&local_110,"a00456.dat");
  pvVar2 = (iterator)0x2;
  pFVar3 = &seq2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_1c0,&local_248,0x16,1,2,pFVar3,"seq1.FileName(pos)",&local_e8,
             "data_dir / \"a00456.dat\"");
  std::filesystem::__cxx11::path::~path(&local_e8);
  std::filesystem::__cxx11::path::~path(&local_110);
  std::filesystem::__cxx11::path::~path((path *)&seq2);
  std::filesystem::__cxx11::path::path(&local_198,&data_dir.super_path);
  fs::operator/((path *)&local_170,(path *)&local_198,"a");
  dir_00.super_path._M_pathname._M_string_length = in_stack_fffffffffffffd70;
  dir_00.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd68;
  dir_00.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffd78;
  dir_00.super_path._M_pathname.field_2._M_local_buf[8] = in_stack_fffffffffffffd80;
  dir_00.super_path._M_pathname.field_2._9_7_ = in_stack_fffffffffffffd81;
  dir_00.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffd88._M_head_impl;
  FlatFileSeq::FlatFileSeq(&seq2,dir_00,(char *)&local_170,0xb6804f);
  std::filesystem::__cxx11::path::~path(&local_170);
  std::filesystem::__cxx11::path::~path(&local_198);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x19;
  file_00.m_begin = (iterator)&local_258;
  msg_00.m_end = (iterator)pFVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_268,
             msg_00);
  FlatFileSeq::FileName((path *)&local_e8,&seq2,&pos);
  std::filesystem::__cxx11::path::path(&local_210,&data_dir.super_path);
  fs::operator/((path *)&local_1e8,(path *)&local_210,"a");
  fs::operator/((path *)local_1c0,(path *)&local_1e8,"b00456.dat");
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (&stack0xfffffffffffffd78,&stack0xfffffffffffffd68,0x19,1,2,&local_e8,
             "seq2.FileName(pos)",(path *)local_1c0,"data_dir / \"a\" / \"b00456.dat\"");
  std::filesystem::__cxx11::path::~path((path *)local_1c0);
  std::filesystem::__cxx11::path::~path(&local_1e8);
  std::filesystem::__cxx11::path::~path(&local_210);
  std::filesystem::__cxx11::path::~path(&local_e8);
  std::filesystem::__cxx11::path::~path((path *)&seq2);
  std::filesystem::__cxx11::path::~path((path *)&seq1);
  std::filesystem::__cxx11::path::~path(&data_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_filename)
{
    const auto data_dir = m_args.GetDataDirBase();

    FlatFilePos pos(456, 789);

    FlatFileSeq seq1(data_dir, "a", 16 * 1024);
    BOOST_CHECK_EQUAL(seq1.FileName(pos), data_dir / "a00456.dat");

    FlatFileSeq seq2(data_dir / "a", "b", 16 * 1024);
    BOOST_CHECK_EQUAL(seq2.FileName(pos), data_dir / "a" / "b00456.dat");

    // Check default constructor IsNull
    assert(FlatFilePos{}.IsNull());
}